

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

uint * __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::operator()
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,uint d0,...)

{
  mapped_type mVar1;
  bool bVar2;
  uint uVar3;
  mapped_type *pmVar4;
  uint local_58;
  uint local_54;
  _Node_iterator_base<std::pair<const_int,_unsigned_int>,_false> local_50;
  uint local_44;
  _Node_iterator_base<std::pair<const_int,_unsigned_int>,_false> local_40;
  iterator iter;
  va_list vl;
  uint index;
  uint d0_local;
  sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_int,_unsigned_int>,_false>._M_cur._4_4_ = 0x30;
  iter.super__Node_iterator_base<std::pair<const_int,_unsigned_int>,_false>._M_cur._0_4_ = 0x10;
  uVar3 = linear_index(this,d0,(__va_list_tag *)&iter);
  local_44 = uVar3;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
       ::find(&this->siteMap,(key_type *)&local_44);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
       ::end(&this->siteMap);
  bVar2 = std::__detail::operator==(&local_40,&local_50);
  if (bVar2) {
    mVar1 = this->defaultValue;
    local_54 = uVar3;
    pmVar4 = std::
             unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->siteMap,(key_type *)&local_54);
    *pmVar4 = mVar1;
  }
  local_58 = uVar3;
  pmVar4 = std::
           unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->siteMap,(key_type *)&local_58);
  return pmVar4;
}

Assistant:

inline T& operator()(unsigned int d0, ...) {
            unsigned int index = 0;
            va_list vl;
            va_start(vl, d0);
            index = linear_index(d0, vl);
            va_end(vl);

            auto iter = siteMap.find(index);
            if(iter == siteMap.end())
                siteMap[index] = defaultValue;

            return siteMap[index];
        }